

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateCache::LoadTemplate(TemplateCache *this,TemplateString *filename,Strip strip)

{
  Mutex *this_00;
  RefcountedTemplate *pRVar1;
  TemplateCacheKey cache_key;
  TemplateCacheKey local_38;
  
  local_38.first = TemplateString::GetGlobalId(filename);
  this_00 = this->mutex_;
  local_38.second = strip;
  Mutex::Lock(this_00);
  pRVar1 = GetTemplateLocked(this,filename,strip,&local_38);
  Mutex::Unlock(this_00);
  return pRVar1 != (RefcountedTemplate *)0x0;
}

Assistant:

bool TemplateCache::LoadTemplate(const TemplateString& filename, Strip strip) {
  TemplateCacheKey cache_key = TemplateCacheKey(filename.GetGlobalId(), strip);
  WriterMutexLock ml(mutex_);
  return GetTemplateLocked(filename, strip, cache_key) != NULL;
}